

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

bool __thiscall Clasp::ClaspFacade::onModel(ClaspFacade *this,Solver *s,Model *m)

{
  bool bVar1;
  SumVec *pSVar2;
  Solver *in_RDX;
  SolveData *in_RSI;
  Model *in_RDI;
  Enumerator *pEVar3;
  ValueVec *pVVar4;
  
  pEVar3 = (Enumerator *)RealTime::getTime();
  in_RDI[8].ctx = pEVar3;
  pSVar2 = (SumVec *)((long)&((in_RDI[8].costs)->ebo_).buf + 1);
  in_RDI[8].costs = pSVar2;
  if (pSVar2 == (SumVec *)0x1) {
    pVVar4 = (ValueVec *)diffTime((double)in_RDI[8].ctx,(double)in_RDI[8].num);
    in_RDI[8].values = pVVar4;
  }
  if (((uint)(in_RDX->lower).bound >> 0x1a & 1) != 0) {
    *(long *)&in_RDI[8].field_0x20 = *(long *)&in_RDI[8].field_0x20 + 1;
  }
  SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::operator->
            ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x126009);
  bVar1 = SolveData::onModel(in_RSI,in_RDX,in_RDI);
  return bVar1;
}

Assistant:

bool ClaspFacade::onModel(const Solver& s, const Model& m) {
	step_.unsatTime = RealTime::getTime();
	if (++step_.numEnum == 1) { step_.satTime = diffTime(step_.unsatTime, step_.solveTime); }
	if (m.opt) { ++step_.numOptimal; }
	return solve_->onModel(s, m);
}